

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void dwt_interleave_v(dwt_t *v,int *a,int x)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  
  piVar3 = v->mem;
  iVar1 = v->cas;
  iVar2 = v->sn;
  piVar4 = a;
  for (lVar5 = 0; iVar2 != (int)lVar5; lVar5 = lVar5 + 1) {
    piVar3[(long)iVar1 + lVar5 * 2] = *piVar4;
    piVar4 = piVar4 + x;
  }
  piVar4 = a + x * v->sn;
  iVar1 = v->cas;
  iVar2 = v->dn;
  for (lVar5 = 0; iVar2 != (int)lVar5; lVar5 = lVar5 + 1) {
    piVar3[(lVar5 * 2 + 1) - (long)iVar1] = *piVar4;
    piVar4 = piVar4 + x;
  }
  return;
}

Assistant:

static void dwt_interleave_v(dwt_t* v, int *a, int x) {
    int *ai = a;
    int *bi = v->mem + v->cas;
    int  i = v->sn;
    while( i-- ) {
      *bi = *ai;
	  bi += 2;
	  ai += x;
    }
    ai = a + (v->sn * x);
    bi = v->mem + 1 - v->cas;
    i = v->dn ;
    while( i-- ) {
      *bi = *ai;
	  bi += 2;  
	  ai += x;
    }
}